

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitRefCast(BinaryInstWriter *this,RefCast *curr)

{
  ulong uVar1;
  WasmBinaryWriter *this_00;
  Exactness exactness;
  HeapType type;
  Type *this_01;
  
  BufferWithRandomAccess::operator<<(this->o,-5);
  uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression.type.id;
  this_01 = &(curr->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression.type;
  BufferWithRandomAccess::operator<<(this->o,(U32LEB)((((uint)uVar1 & 3) == 2 && 6 < uVar1) | 0x16))
  ;
  this_00 = this->parent;
  type = wasm::Type::getHeapType(this_01);
  exactness = wasm::Type::getExactness(this_01);
  WasmBinaryWriter::writeHeapType(this_00,type,exactness);
  return;
}

Assistant:

void BinaryInstWriter::visitRefCast(RefCast* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  if (curr->type.isNullable()) {
    o << U32LEB(BinaryConsts::RefCastNull);
  } else {
    o << U32LEB(BinaryConsts::RefCast);
  }
  parent.writeHeapType(curr->type.getHeapType(), curr->type.getExactness());
}